

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

handle pybind11::detail::
       list_caster<std::vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>,std::shared_ptr<kratos::Generator>>
       ::
       cast<std::vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>>
                 (vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                  *src,return_value_policy policy,handle parent)

{
  PyObject *pPVar1;
  bool bVar2;
  int iVar3;
  size_type size;
  forwarded_type<std::vector<std::shared_ptr<kratos::Generator>_>,_std::shared_ptr<kratos::Generator>_&>
  src_00;
  PyObject **ppPVar4;
  handle local_90;
  int local_84;
  PyObject *local_80;
  PyObject *local_68;
  handle local_60;
  object value_;
  shared_ptr<kratos::Generator> *value;
  iterator __end0;
  iterator __begin0;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  *__range3;
  ssize_t index;
  list l;
  return_value_policy policy_local;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  *src_local;
  handle parent_local;
  
  l.super_object.super_handle.m_ptr._7_1_ = policy;
  l.super_object.super_handle.m_ptr._7_1_ =
       return_value_policy_override<std::shared_ptr<kratos::Generator>,_void>::policy(policy);
  size = std::
         vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
         ::size(src);
  list::list<unsigned_long,_0>((list *)&index,size);
  __range3 = (vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
              *)0x0;
  __end0 = std::
           vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           ::begin(src);
  value = (shared_ptr<kratos::Generator> *)
          std::
          vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
          ::end(src);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
                                *)&value);
    if (!bVar2) break;
    value_.super_handle.m_ptr =
         (handle)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
                 ::operator*(&__end0);
    src_00 = forward_like<std::vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>,std::shared_ptr<kratos::Generator>&>
                       ((shared_ptr<kratos::Generator> *)value_.super_handle.m_ptr);
    local_80 = parent.m_ptr;
    local_68 = (PyObject *)
               copyable_holder_caster<kratos::Generator,_std::shared_ptr<kratos::Generator>,_void>::
               cast(src_00,l.super_object.super_handle.m_ptr._7_1_,parent);
    reinterpret_steal<pybind11::object>((pybind11 *)&local_60,(handle)local_68);
    bVar2 = pybind11::handle::operator_cast_to_bool(&local_60);
    if (bVar2) {
      local_90 = object::release((object *)&local_60);
      ppPVar4 = pybind11::handle::ptr(&local_90);
      pPVar1 = *ppPVar4;
      ppPVar4 = pybind11::handle::ptr((handle *)&index);
      iVar3 = ::PyType_HasFeature((*ppPVar4)->ob_type,0x2000000);
      if (iVar3 == 0) {
        __assert_fail("PyList_Check(l.ptr())",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/pybind11/include/pybind11/stl.h"
                      ,0xa4,
                      "static handle pybind11::detail::list_caster<std::vector<std::shared_ptr<kratos::Generator>>, std::shared_ptr<kratos::Generator>>::cast(T &&, return_value_policy, handle) [Type = std::vector<std::shared_ptr<kratos::Generator>>, Value = std::shared_ptr<kratos::Generator>, T = std::vector<std::shared_ptr<kratos::Generator>>]"
                     );
      }
      ppPVar4 = pybind11::handle::ptr((handle *)&index);
      (&(((*ppPVar4)[1].ob_type)->ob_base).ob_base.ob_refcnt)[(long)__range3] = (Py_ssize_t)pPVar1;
      local_84 = 0;
      __range3 = (vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                  *)((long)&(__range3->
                            super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    else {
      memset(&parent_local,0,8);
      pybind11::handle::handle(&parent_local);
      local_84 = 1;
    }
    object::~object((object *)&local_60);
    if (local_84 != 0) goto LAB_00778ac2;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
    ::operator++(&__end0);
  }
  parent_local = object::release((object *)&index);
  local_84 = 1;
LAB_00778ac2:
  list::~list((list *)&index);
  return (handle)parent_local.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        ssize_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }